

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteSparseArrayIndexProperties<Js::JavascriptArrayIndexStaticEnumerator,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,ArrayType *arr)

{
  bool bVar1;
  uint32 index;
  BOOL BVar2;
  Engine *this_00;
  void *pvStack_38;
  uint32 i;
  Var value;
  JavascriptArrayIndexStaticEnumerator e;
  ScriptContext *scriptContext;
  ArrayType *arr_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  e._8_8_ = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  JavascriptArrayIndexStaticEnumerator::JavascriptArrayIndexStaticEnumerator
            ((JavascriptArrayIndexStaticEnumerator *)&value,arr);
  pvStack_38 = (void *)0x0;
  while (bVar1 = JavascriptArrayIndexStaticEnumerator::MoveNext
                           ((JavascriptArrayIndexStaticEnumerator *)&value), bVar1) {
    index = JavascriptArrayIndexStaticEnumerator::GetIndex
                      ((JavascriptArrayIndexStaticEnumerator *)&value);
    BVar2 = JavascriptArrayItemAccessor::GetItem
                      (arr,index,&stack0xffffffffffffffc8,(ScriptContext *)e._8_8_);
    if (BVar2 != 0) {
      Write(this,index);
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,pvStack_38);
    }
  }
  Write(this,0xffffffff);
  return;
}

Assistant:

void WriteSparseArrayIndexProperties(typename IndexEnumerator::ArrayType* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            IndexEnumerator e(arr);
            Var value = nullptr;

            while (e.MoveNext())
            {
                uint32 i = e.GetIndex();
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    Write(i);
                    this->GetEngine()->Clone(value);
                }
            }

            Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }